

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtbdd.c
# Opt level: O0

void * Abc_NtkBuildGlobalBdds
                 (Abc_Ntk_t *pNtk,int nBddSizeMax,int fDropInternal,int fReorder,int fReverse,
                 int fVerbose)

{
  FILE *pFile;
  uint numVars;
  int iVar1;
  int iVar2;
  void *pvVar3;
  Abc_Obj_t *pNode;
  DdNode *pDVar4;
  DdNode *local_80;
  int local_6c;
  int local_68;
  int Counter;
  int k;
  int i;
  DdNode *bFunc;
  DdManager *dd;
  Vec_Att_t *pAttMan;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  ProgressBar *pProgress;
  int local_28;
  int fVerbose_local;
  int fReverse_local;
  int fReorder_local;
  int fDropInternal_local;
  int nBddSizeMax_local;
  Abc_Ntk_t *pNtk_local;
  
  pProgress._4_4_ = fVerbose;
  local_28 = fReverse;
  fVerbose_local = fReorder;
  fReverse_local = fDropInternal;
  fReorder_local = nBddSizeMax;
  _fDropInternal_local = pNtk;
  Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
  pvVar3 = Abc_NtkGlobalBdd(_fDropInternal_local);
  if (pvVar3 != (void *)0x0) {
    __assert_fail("Abc_NtkGlobalBdd(pNtk) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcNtbdd.c"
                  ,0x148,"void *Abc_NtkBuildGlobalBdds(Abc_Ntk_t *, int, int, int, int, int)");
  }
  numVars = Abc_NtkCiNum(_fDropInternal_local);
  bFunc = &Cudd_Init(numVars,0,0x100,0x40000,0)->sentinel;
  iVar1 = Abc_NtkObjNumMax(_fDropInternal_local);
  dd = (DdManager *)
       Vec_AttAlloc(iVar1 + 1,bFunc,Extra_StopManager,(_func_void_ptr_void_ptr *)0x0,
                    Cudd_RecursiveDeref);
  Vec_PtrWriteEntry(_fDropInternal_local->vAttrs,7,dd);
  if (fVerbose_local != 0) {
    Cudd_AutodynEnable((DdManager *)bFunc,CUDD_REORDER_SYMM_SIFT);
  }
  pFanin = Abc_AigConst1(_fDropInternal_local);
  iVar1 = Abc_ObjFanoutNum(pFanin);
  if (0 < iVar1) {
    _k = *(DdNode **)(bFunc + 1);
    Abc_ObjSetGlobalBdd(pFanin,_k);
    Cudd_Ref(_k);
  }
  for (Counter = 0; iVar1 = Counter, iVar2 = Abc_NtkCiNum(_fDropInternal_local), pFile = _stdout,
      iVar1 < iVar2; Counter = Counter + 1) {
    pFanin = Abc_NtkCi(_fDropInternal_local,Counter);
    iVar1 = Abc_ObjFanoutNum(pFanin);
    if (0 < iVar1) {
      if (local_28 == 0) {
        local_80 = *(DdNode **)(&(bFunc[8].type.kids.E)->index + (long)Counter * 2);
      }
      else {
        pDVar4 = bFunc[8].type.kids.E;
        iVar1 = Abc_NtkCiNum(_fDropInternal_local);
        local_80 = *(DdNode **)(&pDVar4->index + (long)((iVar1 + -1) - Counter) * 2);
      }
      _k = local_80;
      Abc_ObjSetGlobalBdd(pFanin,local_80);
      Cudd_Ref(_k);
    }
  }
  local_6c = 0;
  iVar1 = Abc_NtkNodeNum(_fDropInternal_local);
  pObj = (Abc_Obj_t *)Extra_ProgressBarStart(pFile,iVar1);
  Counter = 0;
  while( true ) {
    iVar1 = Counter;
    iVar2 = Abc_NtkCoNum(_fDropInternal_local);
    if (iVar2 <= iVar1) {
      Extra_ProgressBarStop((ProgressBar *)pObj);
      for (Counter = 0; iVar1 = Counter, iVar2 = Vec_PtrSize(_fDropInternal_local->vObjs),
          iVar1 < iVar2; Counter = Counter + 1) {
        pFanin = Abc_NtkObj(_fDropInternal_local,Counter);
        if (((pFanin != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsBox(pFanin), iVar1 == 0)) &&
           (iVar1 = Abc_ObjIsBi(pFanin), iVar1 == 0)) {
          (pFanin->vFanouts).nSize = 0;
        }
      }
      for (Counter = 0; iVar1 = Counter, iVar2 = Vec_PtrSize(_fDropInternal_local->vObjs),
          iVar1 < iVar2; Counter = Counter + 1) {
        pFanin = Abc_NtkObj(_fDropInternal_local,Counter);
        if (((pFanin != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsBox(pFanin), iVar1 == 0)) &&
           (iVar1 = Abc_ObjIsBo(pFanin), iVar1 == 0)) {
          for (local_68 = 0; iVar1 = local_68, iVar2 = Abc_ObjFaninNum(pFanin), iVar1 < iVar2;
              local_68 = local_68 + 1) {
            pAttMan = (Vec_Att_t *)Abc_ObjFanin(pFanin,local_68);
            (((Abc_Obj_t *)pAttMan)->vFanouts).nSize = (((Abc_Obj_t *)pAttMan)->vFanouts).nSize + 1;
          }
        }
      }
      if (fVerbose_local != 0) {
        Cudd_ReduceHeap((DdManager *)bFunc,CUDD_REORDER_SYMM_SIFT,1);
        Cudd_AutodynDisable((DdManager *)bFunc);
      }
      return bFunc;
    }
    pFanin = Abc_NtkCo(_fDropInternal_local,Counter);
    pDVar4 = bFunc;
    pNode = Abc_ObjFanin0(pFanin);
    pDVar4 = Abc_NodeGlobalBdds_rec
                       ((DdManager *)pDVar4,pNode,fReorder_local,fReverse_local,(ProgressBar *)pObj,
                        &local_6c,pProgress._4_4_);
    _k = pDVar4;
    if (pDVar4 == (DdNode *)0x0) break;
    iVar1 = Abc_ObjFaninC0(pFanin);
    _k = (DdNode *)((ulong)pDVar4 ^ (long)iVar1);
    Cudd_Ref(_k);
    Abc_ObjSetGlobalBdd(pFanin,_k);
    Counter = Counter + 1;
  }
  if (pProgress._4_4_ != 0) {
    printf("Constructing global BDDs is aborted.\n");
  }
  Abc_NtkFreeGlobalBdds(_fDropInternal_local,0);
  Cudd_Quit((DdManager *)bFunc);
  for (Counter = 0; iVar1 = Counter, iVar2 = Vec_PtrSize(_fDropInternal_local->vObjs), iVar1 < iVar2
      ; Counter = Counter + 1) {
    pFanin = Abc_NtkObj(_fDropInternal_local,Counter);
    if (((pFanin != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsBox(pFanin), iVar1 == 0)) &&
       (iVar1 = Abc_ObjIsBi(pFanin), iVar1 == 0)) {
      (pFanin->vFanouts).nSize = 0;
    }
  }
  for (Counter = 0; iVar1 = Counter, iVar2 = Vec_PtrSize(_fDropInternal_local->vObjs), iVar1 < iVar2
      ; Counter = Counter + 1) {
    pFanin = Abc_NtkObj(_fDropInternal_local,Counter);
    if (((pFanin != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsBox(pFanin), iVar1 == 0)) &&
       (iVar1 = Abc_ObjIsBo(pFanin), iVar1 == 0)) {
      for (local_68 = 0; iVar1 = local_68, iVar2 = Abc_ObjFaninNum(pFanin), iVar1 < iVar2;
          local_68 = local_68 + 1) {
        pAttMan = (Vec_Att_t *)Abc_ObjFanin(pFanin,local_68);
        (((Abc_Obj_t *)pAttMan)->vFanouts).nSize = (((Abc_Obj_t *)pAttMan)->vFanouts).nSize + 1;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void * Abc_NtkBuildGlobalBdds( Abc_Ntk_t * pNtk, int nBddSizeMax, int fDropInternal, int fReorder, int fReverse, int fVerbose )
{
    ProgressBar * pProgress;
    Abc_Obj_t * pObj, * pFanin;
    Vec_Att_t * pAttMan;
    DdManager * dd;
    DdNode * bFunc;
    int i, k, Counter;

    // remove dangling nodes
    Abc_AigCleanup( (Abc_Aig_t *)pNtk->pManFunc );

    // start the manager
    assert( Abc_NtkGlobalBdd(pNtk) == NULL );
    dd = Cudd_Init( Abc_NtkCiNum(pNtk), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    pAttMan = Vec_AttAlloc( Abc_NtkObjNumMax(pNtk) + 1, dd, (void (*)(void*))Extra_StopManager, NULL, (void (*)(void*,void*))Cudd_RecursiveDeref );
    Vec_PtrWriteEntry( pNtk->vAttrs, VEC_ATTR_GLOBAL_BDD, pAttMan );

    // set reordering
    if ( fReorder )
        Cudd_AutodynEnable( dd, CUDD_REORDER_SYMM_SIFT );

    // assign the constant node BDD
    pObj = Abc_AigConst1(pNtk);
    if ( Abc_ObjFanoutNum(pObj) > 0 )
    {
        bFunc = dd->one;
        Abc_ObjSetGlobalBdd( pObj, bFunc );   Cudd_Ref( bFunc );
    }
    // set the elementary variables
    Abc_NtkForEachCi( pNtk, pObj, i )
        if ( Abc_ObjFanoutNum(pObj) > 0 )
        {
            bFunc = fReverse ? dd->vars[Abc_NtkCiNum(pNtk) - 1 - i] : dd->vars[i];
            Abc_ObjSetGlobalBdd( pObj, bFunc );  Cudd_Ref( bFunc );
        }

    // collect the global functions of the COs
    Counter = 0;
    // construct the BDDs
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkNodeNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        bFunc = Abc_NodeGlobalBdds_rec( dd, Abc_ObjFanin0(pObj), nBddSizeMax, fDropInternal, pProgress, &Counter, fVerbose );
        if ( bFunc == NULL )
        {
            if ( fVerbose )
            printf( "Constructing global BDDs is aborted.\n" );
            Abc_NtkFreeGlobalBdds( pNtk, 0 );
            Cudd_Quit( dd ); 

            // reset references
            Abc_NtkForEachObj( pNtk, pObj, i )
                if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBi(pObj) )
                    pObj->vFanouts.nSize = 0;
            Abc_NtkForEachObj( pNtk, pObj, i )
                if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBo(pObj) )
                    Abc_ObjForEachFanin( pObj, pFanin, k )
                        pFanin->vFanouts.nSize++;
            return NULL;
        }
        bFunc = Cudd_NotCond( bFunc, (int)Abc_ObjFaninC0(pObj) );  Cudd_Ref( bFunc ); 
        Abc_ObjSetGlobalBdd( pObj, bFunc );
    }
    Extra_ProgressBarStop( pProgress );

/*
    // derefence the intermediate BDDs
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( pObj->pCopy ) 
        {
            Cudd_RecursiveDeref( dd, (DdNode *)pObj->pCopy );
            pObj->pCopy = NULL;
        }
*/
/*
    // make sure all nodes are derefed
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( pObj->pCopy != NULL )
            printf( "Abc_NtkBuildGlobalBdds() error: Node %d has BDD assigned\n", pObj->Id );
        if ( pObj->vFanouts.nSize > 0 )
            printf( "Abc_NtkBuildGlobalBdds() error: Node %d has refs assigned\n", pObj->Id );
    }
*/
    // reset references
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBi(pObj) )
            pObj->vFanouts.nSize = 0;
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBo(pObj) )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                pFanin->vFanouts.nSize++;

    // reorder one more time
    if ( fReorder )
    {
        Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 1 );
        Cudd_AutodynDisable( dd );
    }
//    Cudd_PrintInfo( dd, stdout );
    return dd;
}